

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_get_rows(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  int64_t iVar3;
  long lVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  code *pcVar15;
  void *pvVar16;
  void *pvVar17;
  void *pvVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  undefined8 uVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  
  pgVar1 = dst->src[0];
  switch(pgVar1->type) {
  case GGML_TYPE_F32:
  case GGML_TYPE_I32:
    pgVar2 = dst->src[1];
    iVar3 = pgVar1->ne[0];
    lVar4 = pgVar1->ne[1];
    sVar5 = pgVar1->nb[1];
    sVar6 = pgVar1->nb[2];
    sVar7 = pgVar1->nb[3];
    lVar8 = pgVar2->ne[0];
    lVar28 = pgVar2->ne[1];
    sVar9 = pgVar2->nb[0];
    sVar10 = pgVar2->nb[1];
    sVar11 = pgVar2->nb[2];
    sVar12 = dst->nb[1];
    sVar13 = dst->nb[2];
    sVar14 = dst->nb[3];
    lVar20 = ggml_nelements();
    iVar19 = (int)((lVar20 + -1 + (long)params->nth) / (long)params->nth);
    lVar21 = (long)params->ith * (long)iVar19;
    iVar19 = iVar19 + (int)lVar21;
    if (lVar20 <= iVar19) {
      iVar19 = (int)lVar20;
    }
    if ((int)lVar21 < iVar19) {
      lVar28 = lVar28 * lVar8;
      pvVar16 = pgVar2->data;
      uVar26 = (uint)iVar3;
      do {
        lVar20 = lVar21 / lVar28;
        lVar23 = lVar21 % lVar28;
        lVar27 = lVar23 / lVar8;
        lVar23 = lVar23 % lVar8;
        lVar24 = (long)*(int *)((long)pvVar16 + lVar20 * sVar11 + lVar27 * sVar10 + lVar23 * sVar9);
        if ((lVar24 < 0) || (lVar4 <= lVar24)) {
          uVar25 = 0x10d1;
LAB_0013d536:
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
                     ,uVar25,"GGML_ASSERT(%s) failed","i01 >= 0 && i01 < ne01");
        }
        if (0 < (int)uVar26) {
          pvVar17 = dst->data;
          pvVar18 = pgVar1->data;
          uVar22 = 0;
          do {
            *(undefined4 *)
             ((long)pvVar17 + uVar22 * 4 + lVar27 * sVar13 + lVar23 * sVar12 + lVar20 * sVar14) =
                 *(undefined4 *)
                  ((long)pvVar18 + uVar22 * 4 + lVar24 * sVar5 + lVar20 * sVar7 + lVar27 * sVar6);
            uVar22 = uVar22 + 1;
          } while ((uVar26 & 0x7fffffff) != uVar22);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != iVar19);
    }
    break;
  case GGML_TYPE_F16:
    pgVar2 = dst->src[1];
    iVar3 = pgVar1->ne[0];
    lVar4 = pgVar1->ne[1];
    sVar5 = pgVar1->nb[1];
    sVar6 = pgVar1->nb[2];
    sVar7 = pgVar1->nb[3];
    lVar8 = pgVar2->ne[0];
    lVar28 = pgVar2->ne[1];
    sVar9 = pgVar2->nb[0];
    sVar10 = pgVar2->nb[1];
    sVar11 = pgVar2->nb[2];
    sVar12 = dst->nb[1];
    sVar13 = dst->nb[2];
    sVar14 = dst->nb[3];
    lVar20 = ggml_nelements(pgVar2);
    iVar19 = (int)((lVar20 + -1 + (long)params->nth) / (long)params->nth);
    lVar21 = (long)params->ith * (long)iVar19;
    iVar19 = iVar19 + (int)lVar21;
    if (lVar20 <= iVar19) {
      iVar19 = (int)lVar20;
    }
    if ((int)lVar21 < iVar19) {
      lVar28 = lVar28 * lVar8;
      do {
        lVar20 = lVar21 / lVar28;
        lVar24 = lVar21 % lVar28;
        lVar27 = lVar24 / lVar8;
        lVar24 = lVar24 % lVar8;
        lVar23 = (long)*(int *)((long)pgVar2->data +
                               lVar20 * sVar11 + lVar27 * sVar10 + lVar24 * sVar9);
        if ((lVar23 < 0) || (lVar4 <= lVar23)) {
          uVar25 = 0x107f;
          goto LAB_0013d536;
        }
        ggml_fp16_to_fp32_row
                  ((long)pgVar1->data + lVar20 * sVar7 + lVar27 * sVar6 + lVar23 * sVar5,
                   (long)dst->data + lVar27 * sVar13 + lVar20 * sVar14 + lVar24 * sVar12,iVar3);
        lVar21 = lVar21 + 1;
      } while (iVar19 != lVar21);
    }
    break;
  case GGML_TYPE_Q4_0:
  case GGML_TYPE_Q4_1:
  case GGML_TYPE_Q5_0:
  case GGML_TYPE_Q5_1:
  case GGML_TYPE_Q8_0:
  case GGML_TYPE_Q8_1:
  case GGML_TYPE_Q2_K:
  case GGML_TYPE_Q3_K:
  case GGML_TYPE_Q4_K:
  case GGML_TYPE_Q5_K:
  case GGML_TYPE_Q6_K:
  case GGML_TYPE_IQ2_XXS:
  case GGML_TYPE_IQ2_XS:
  case GGML_TYPE_IQ3_XXS:
  case GGML_TYPE_IQ1_S:
  case GGML_TYPE_IQ4_NL:
  case GGML_TYPE_IQ3_S:
  case GGML_TYPE_IQ2_S:
  case GGML_TYPE_IQ4_XS:
  case GGML_TYPE_IQ1_M:
  case GGML_TYPE_TQ1_0:
  case GGML_TYPE_TQ2_0:
    pgVar2 = dst->src[1];
    iVar3 = pgVar1->ne[0];
    lVar4 = pgVar1->ne[1];
    sVar5 = pgVar1->nb[1];
    sVar6 = pgVar1->nb[2];
    sVar7 = pgVar1->nb[3];
    lVar8 = pgVar2->ne[0];
    lVar28 = pgVar2->ne[1];
    sVar9 = pgVar2->nb[0];
    sVar10 = pgVar2->nb[1];
    sVar11 = pgVar2->nb[2];
    sVar12 = dst->nb[1];
    sVar13 = dst->nb[2];
    sVar14 = dst->nb[3];
    lVar20 = ggml_nelements(pgVar2);
    lVar21 = ggml_get_type_traits(pgVar1->type);
    iVar19 = (int)((lVar20 + -1 + (long)params->nth) / (long)params->nth);
    lVar27 = (long)params->ith * (long)iVar19;
    iVar19 = iVar19 + (int)lVar27;
    if (lVar20 <= iVar19) {
      iVar19 = (int)lVar20;
    }
    if ((int)lVar27 < iVar19) {
      pcVar15 = *(code **)(lVar21 + 0x28);
      lVar28 = lVar28 * lVar8;
      do {
        lVar20 = lVar27 / lVar28;
        lVar24 = lVar27 % lVar28;
        lVar21 = lVar24 / lVar8;
        lVar24 = lVar24 % lVar8;
        lVar23 = (long)*(int *)((long)pgVar2->data +
                               lVar20 * sVar11 + lVar21 * sVar10 + lVar24 * sVar9);
        if ((lVar23 < 0) || (lVar4 <= lVar23)) {
          uVar25 = 0x1056;
          goto LAB_0013d536;
        }
        (*pcVar15)((long)pgVar1->data + lVar20 * sVar7 + lVar21 * sVar6 + lVar23 * sVar5,
                   (long)dst->data + lVar21 * sVar13 + lVar20 * sVar14 + lVar24 * sVar12,iVar3);
        lVar27 = lVar27 + 1;
      } while (iVar19 != lVar27);
    }
    break;
  default:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
               ,0x1108,"fatal error");
  case GGML_TYPE_BF16:
    pgVar2 = dst->src[1];
    iVar3 = pgVar1->ne[0];
    lVar4 = pgVar1->ne[1];
    sVar5 = pgVar1->nb[1];
    sVar6 = pgVar1->nb[2];
    sVar7 = pgVar1->nb[3];
    lVar8 = pgVar2->ne[0];
    lVar28 = pgVar2->ne[1];
    sVar9 = pgVar2->nb[0];
    sVar10 = pgVar2->nb[1];
    sVar11 = pgVar2->nb[2];
    sVar12 = dst->nb[1];
    sVar13 = dst->nb[2];
    sVar14 = dst->nb[3];
    lVar20 = ggml_nelements(pgVar2);
    iVar19 = (int)((lVar20 + -1 + (long)params->nth) / (long)params->nth);
    lVar21 = (long)params->ith * (long)iVar19;
    iVar19 = iVar19 + (int)lVar21;
    if (lVar20 <= iVar19) {
      iVar19 = (int)lVar20;
    }
    if ((int)lVar21 < iVar19) {
      lVar28 = lVar28 * lVar8;
      do {
        lVar20 = lVar21 / lVar28;
        lVar24 = lVar21 % lVar28;
        lVar27 = lVar24 / lVar8;
        lVar24 = lVar24 % lVar8;
        lVar23 = (long)*(int *)((long)pgVar2->data +
                               lVar20 * sVar11 + lVar27 * sVar10 + lVar24 * sVar9);
        if ((lVar23 < 0) || (lVar4 <= lVar23)) {
          uVar25 = 0x10a8;
          goto LAB_0013d536;
        }
        ggml_bf16_to_fp32_row
                  ((long)pgVar1->data + lVar20 * sVar7 + lVar27 * sVar6 + lVar23 * sVar5,
                   (long)dst->data + lVar27 * sVar13 + lVar20 * sVar14 + lVar24 * sVar12,iVar3);
        lVar21 = lVar21 + 1;
      } while (iVar19 != lVar21);
    }
  }
  return;
}

Assistant:

void ggml_compute_forward_get_rows(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_Q4_0:
        case GGML_TYPE_Q4_1:
        case GGML_TYPE_Q5_0:
        case GGML_TYPE_Q5_1:
        case GGML_TYPE_Q8_0:
        case GGML_TYPE_Q8_1:
        case GGML_TYPE_Q2_K:
        case GGML_TYPE_Q3_K:
        case GGML_TYPE_Q4_K:
        case GGML_TYPE_Q5_K:
        case GGML_TYPE_Q6_K:
        case GGML_TYPE_TQ1_0:
        case GGML_TYPE_TQ2_0:
        case GGML_TYPE_IQ2_XXS:
        case GGML_TYPE_IQ2_XS:
        case GGML_TYPE_IQ3_XXS:
        case GGML_TYPE_IQ1_S:
        case GGML_TYPE_IQ1_M:
        case GGML_TYPE_IQ4_NL:
        case GGML_TYPE_IQ4_XS:
        case GGML_TYPE_IQ3_S:
        case GGML_TYPE_IQ2_S:
            {
                ggml_compute_forward_get_rows_q(params, dst);
            } break;
        case GGML_TYPE_F16:
            {
                ggml_compute_forward_get_rows_f16(params, dst);
            } break;
        case GGML_TYPE_BF16:
            {
                ggml_compute_forward_get_rows_bf16(params, dst);
            } break;
        case GGML_TYPE_F32:
        case GGML_TYPE_I32:
            {
                ggml_compute_forward_get_rows_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }

    //static bool first = true;
    //printf("ne0 = %d, ne1 = %d, ne2 = %d\n", dst->ne[0], dst->ne[1], dst->ne[2]);
    //if (first) {
    //    first = false;
    //} else {
    //    for (int k = 0; k < dst->ne[1]; ++k) {
    //        for (int j = 0; j < dst->ne[0]/16; ++j) {
    //            for (int i = 0; i < 16; ++i) {
    //                printf("%8.4f ", ((float *) dst->data)[k*dst->ne[0] + j*16 + i]);
    //            }
    //            printf("\n");
    //        }
    //        printf("\n");
    //    }
    //    printf("\n");
    //    exit(0);
    //}
}